

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O1

uint32_t spvtools::val::anon_unknown_0::GetPlaneCoordSize(ImageTypeInfo *info)

{
  Dim DVar1;
  uint32_t uVar2;
  
  DVar1 = info->dim;
  if (DVar1 < (DimSubpassData|Dim2D)) {
    if ((0x52U >> (DVar1 & 0x1f) & 1) == 0) {
      uVar2 = 1;
      if ((0xcU >> (DVar1 & 0x1f) & 1) != 0) {
        uVar2 = 3;
      }
      return uVar2;
    }
  }
  else if (DVar1 != TileImageDataEXT) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_image.cpp"
                  ,0xdf,
                  "uint32_t spvtools::val::(anonymous namespace)::GetPlaneCoordSize(const ImageTypeInfo &)"
                 );
  }
  return 2;
}

Assistant:

uint32_t GetPlaneCoordSize(const ImageTypeInfo& info) {
  uint32_t plane_size = 0;
  // If this switch breaks your build, please add new values below.
  switch (info.dim) {
    case spv::Dim::Dim1D:
    case spv::Dim::Buffer:
      plane_size = 1;
      break;
    case spv::Dim::Dim2D:
    case spv::Dim::Rect:
    case spv::Dim::SubpassData:
    case spv::Dim::TileImageDataEXT:
      plane_size = 2;
      break;
    case spv::Dim::Dim3D:
    case spv::Dim::Cube:
      // For Cube direction vector is used instead of UV.
      plane_size = 3;
      break;
    case spv::Dim::Max:
    default:
      assert(0);
      break;
  }

  return plane_size;
}